

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QHybrid.cpp
# Opt level: O2

void __thiscall QHybrid::ComputeWithCachedQValues(QHybrid *this,bool computeIfNotCached)

{
  uint uVar1;
  long lVar2;
  ostream *poVar3;
  undefined8 *puVar4;
  E *this_00;
  string filenameCache;
  char *local_3f0 [4];
  string local_3d0;
  ifstream fp;
  ostream local_3a0 [16];
  uint auStack_390 [122];
  stringstream ss;
  ostream local_198 [376];
  
  lVar2 = *(long *)((long)this->super_QFunctionJAOHInterface + -0x88);
  (**(code **)(*(long *)(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar2) + 0x40))
            (&filenameCache,&(this->super_QFunctionJAOHInterface).field_0x0 + lVar2);
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar3 = std::operator<<(local_198,(string *)&filenameCache);
  std::operator<<(poVar3,"_firstTS");
  std::__cxx11::stringbuf::str();
  std::ifstream::ifstream(&fp,local_3f0[0],_S_in);
  std::__cxx11::string::~string((string *)local_3f0);
  uVar1 = *(uint *)((long)auStack_390 + *(long *)(_fp + -0x18));
  std::ifstream::~ifstream(&fp);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  if ((uVar1 & 5) == 0 || computeIfNotCached) {
    if ((uVar1 & 5) == 0) {
      puVar4 = (undefined8 *)((long)this->super_QFunctionJAOHInterface + 0x28);
    }
    else {
      (**(code **)((long)this->super_QFunctionJAOHInterface + 0x10))(this);
      puVar4 = (undefined8 *)((long)this->super_QFunctionJAOHInterface + 0x38);
    }
    (*(code *)*puVar4)(this,&filenameCache);
    std::__cxx11::string::~string((string *)&filenameCache);
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&fp);
  poVar3 = std::operator<<(local_3a0,"QHybrid::ComputeWithCachedQValues: Q function ");
  poVar3 = std::operator<<(poVar3,(string *)&filenameCache);
  std::operator<<(poVar3," not cached, bailing out");
  this_00 = (E *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  E::E(this_00,&local_3d0);
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

void QHybrid::ComputeWithCachedQValues(bool computeIfNotCached)
{
    string filenameCache=GetCacheFilename();

    // check whether both files exist
    bool cached=true;
    {
        stringstream ss;
        ss << filenameCache << "_firstTS";
        ifstream fp(ss.str().c_str());
        if(!fp)
            cached=false;
    }

    if(!cached && !computeIfNotCached)
    {
        stringstream ss;
        ss << "QHybrid::ComputeWithCachedQValues: Q function "
           << filenameCache << " not cached, bailing out";
        throw(E(ss.str()));
        return;
    }

    // Couldn't open cache file, so compute
    if(!cached)
    {
        Compute();
        Save(filenameCache);
    }
    else // load Q values from file
        Load(filenameCache);
}